

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

void __thiscall XmlRpc::XmlRpcValue::assertArrayConst(XmlRpcValue *this,int size)

{
  string *psVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type != TypeArray) {
    psVar1 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"type error: expected an array","");
    *(string **)psVar1 = psVar1 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
    *(undefined4 *)(psVar1 + 0x20) = 0xffffffff;
    __cxa_throw(psVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  if (size <= (int)((ulong)((long)(((this->_value).asBinary)->
                                  super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(((this->_value).asBinary)->
                                 super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 4)) {
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"range error: array index too large","");
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
  *(undefined4 *)(psVar1 + 0x20) = 0xffffffff;
  __cxa_throw(psVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
}

Assistant:

void XmlRpcValue::assertArrayConst(int size) const
  {
    if (_type != TypeArray)
      throw XmlRpcException("type error: expected an array");
    else if (int(_value.asArray->size()) < size)
      throw XmlRpcException("range error: array index too large");
  }